

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

void IoTHubClientCore_LL_Destroy(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle)

{
  IOTHUB_CLIENT_CORE_LL_HANDLE pIVar1;
  PDLIST_ENTRY pDVar2;
  IOTHUB_DEVICE_TWIN *temp_2;
  IOTHUB_DEVICE_TWIN *temp_1;
  IOTHUB_MESSAGE_LIST *temp;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  PDLIST_ENTRY unsend;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  if (iotHubClientHandle != (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    (*iotHubClientHandle->IoTHubTransport_Unregister)(iotHubClientHandle->deviceHandle);
    if ((iotHubClientHandle->isSharedTransport & 1U) == 0) {
      (*iotHubClientHandle->IoTHubTransport_Destroy)(iotHubClientHandle->transportHandle);
    }
    while (pIVar1 = (IOTHUB_CLIENT_CORE_LL_HANDLE)
                    DList_RemoveHeadList(&iotHubClientHandle->waitingToSend),
          pIVar1 != iotHubClientHandle) {
      if (pIVar1[-1].event_callbacks != (SINGLYLINKEDLIST_HANDLE)0x0) {
        (*(code *)pIVar1[-1].event_callbacks)(1,pIVar1[-1].model_id);
      }
      IoTHubMessage_Destroy((IOTHUB_MESSAGE_HANDLE)pIVar1[-1].diagnostic_setting);
      free(&pIVar1[-1].diagnostic_setting);
    }
    while (pDVar2 = DList_RemoveHeadList(&iotHubClientHandle->iot_msg_queue),
          pDVar2 != &iotHubClientHandle->iot_msg_queue) {
      if (pDVar2[-2].Blink != (DLIST_ENTRY_TAG *)0x0) {
        (*(code *)pDVar2[-2].Blink)(0,pDVar2[-1].Blink);
      }
      device_twin_data_destroy((IOTHUB_DEVICE_TWIN *)&pDVar2[-3].Blink);
    }
    while (pDVar2 = DList_RemoveHeadList(&iotHubClientHandle->iot_ack_queue),
          pDVar2 != &iotHubClientHandle->iot_ack_queue) {
      if (pDVar2[-2].Blink != (DLIST_ENTRY_TAG *)0x0) {
        (*(code *)pDVar2[-2].Blink)(0,pDVar2[-1].Blink);
      }
      device_twin_data_destroy((IOTHUB_DEVICE_TWIN *)&pDVar2[-3].Blink);
    }
    delete_event_callback_list(iotHubClientHandle);
    IoTHubClient_Auth_Destroy(iotHubClientHandle->authorization_module);
    tickcounter_destroy(iotHubClientHandle->tickCounter);
    IoTHubClient_LL_UploadToBlob_Destroy(iotHubClientHandle->uploadToBlobHandle);
    STRING_delete(iotHubClientHandle->product_info);
    STRING_delete(iotHubClientHandle->model_id);
    free(iotHubClientHandle);
  }
  return;
}

Assistant:

void IoTHubClientCore_LL_Destroy(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle)
{
    if (iotHubClientHandle != NULL)
    {
        PDLIST_ENTRY unsend;
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        handleData->IoTHubTransport_Unregister(handleData->deviceHandle);
        if (handleData->isSharedTransport == false)
        {
            handleData->IoTHubTransport_Destroy(handleData->transportHandle);
        }
        /*if any, remove the items currently not send*/
        while ((unsend = DList_RemoveHeadList(&(handleData->waitingToSend))) != &(handleData->waitingToSend))
        {
            IOTHUB_MESSAGE_LIST* temp = containingRecord(unsend, IOTHUB_MESSAGE_LIST, entry);
            if (temp->callback != NULL)
            {
                temp->callback(IOTHUB_CLIENT_CONFIRMATION_BECAUSE_DESTROY, temp->context);
            }
            IoTHubMessage_Destroy(temp->messageHandle);
            free(temp);
        }

        while ((unsend = DList_RemoveHeadList(&(handleData->iot_msg_queue))) != &(handleData->iot_msg_queue))
        {
            IOTHUB_DEVICE_TWIN* temp = containingRecord(unsend, IOTHUB_DEVICE_TWIN, entry);

            // The Twin reported properties status codes are based on HTTP codes and provided by the service.
            // Following design already implemented in the transport layer, the status code shall be artificially 
            // returned as zero to indicate the report was not sent due to the client being destroyed.
            if (temp->reported_state_callback != NULL)
            {
                temp->reported_state_callback(ERROR_CODE_BECAUSE_DESTROY, temp->context);
            }  

            device_twin_data_destroy(temp);
        }
        while ((unsend = DList_RemoveHeadList(&(handleData->iot_ack_queue))) != &(handleData->iot_ack_queue))
        {
            IOTHUB_DEVICE_TWIN* temp = containingRecord(unsend, IOTHUB_DEVICE_TWIN, entry);

            // The Twin reported properties status codes are based on HTTP codes and provided by the service.
            // Following design already implemented in the transport layer, the status code shall be artificially 
            // returned as zero to indicate the report was not sent due to the client being destroyed.
            if (temp->reported_state_callback != NULL)
            {
                temp->reported_state_callback(ERROR_CODE_BECAUSE_DESTROY, temp->context);
            }

            device_twin_data_destroy(temp);
        }

        delete_event_callback_list(handleData);

        IoTHubClient_Auth_Destroy(handleData->authorization_module);
        tickcounter_destroy(handleData->tickCounter);
#ifndef DONT_USE_UPLOADTOBLOB
        IoTHubClient_LL_UploadToBlob_Destroy(handleData->uploadToBlobHandle);
#endif
#ifdef USE_EDGE_MODULES
        IoTHubClient_EdgeHandle_Destroy(handleData->methodHandle);
#endif
        STRING_delete(handleData->product_info);
        STRING_delete(handleData->model_id);
        free(handleData);
    }
}